

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_ep_match(ipc_ep *ep)

{
  nni_aio *aio_00;
  void *item;
  ipc_pipe *p;
  nni_aio *aio;
  ipc_ep *ep_local;
  
  aio_00 = ep->user_aio;
  if ((aio_00 != (nni_aio *)0x0) && (item = nni_list_first(&ep->wait_pipes), item != (void *)0x0)) {
    nni_list_remove(&ep->wait_pipes,item);
    ep->user_aio = (nni_aio *)0x0;
    *(size_t *)((long)item + 0x10) = ep->rcv_max;
    nni_aio_set_output(aio_00,0,*(void **)((long)item + 0x28));
    nni_aio_finish(aio_00,NNG_OK,0);
  }
  return;
}

Assistant:

static void
ipc_ep_match(ipc_ep *ep)
{
	nni_aio  *aio;
	ipc_pipe *p;

	if (((aio = ep->user_aio) == NULL) ||
	    ((p = nni_list_first(&ep->wait_pipes)) == NULL)) {
		return;
	}
	nni_list_remove(&ep->wait_pipes, p);
	ep->user_aio = NULL;
	p->rcv_max   = ep->rcv_max;
	nni_aio_set_output(aio, 0, p->pipe);
	nni_aio_finish(aio, 0, 0);
}